

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::Attribute::get<tinyusdz::value::matrix4d>
          (Attribute *this,double t,matrix4d *dst,TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  value_type *pvVar2;
  long lVar3;
  long lVar4;
  storage_t<tinyusdz::value::matrix4d> *psVar5;
  storage_t<tinyusdz::value::matrix4d> *psVar6;
  byte bVar7;
  optional<tinyusdz::value::matrix4d> v;
  optional<tinyusdz::value::matrix4d> local_b0;
  
  bVar7 = 0;
  if (dst == (matrix4d *)0x0) {
    return false;
  }
  if (NAN(t)) {
    bVar1 = primvar::PrimVar::has_value(&this->_var);
    if (bVar1) {
      primvar::PrimVar::get_value<tinyusdz::value::matrix4d>(&local_b0,&this->_var);
      v.has_value_ = local_b0.has_value_;
      if (local_b0.has_value_ != false) {
        lVar4 = 0x10;
        psVar5 = &local_b0.contained;
        psVar6 = &v.contained;
        for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
          *(undefined8 *)psVar6 = *(undefined8 *)psVar5;
          psVar5 = (storage_t<tinyusdz::value::matrix4d> *)
                   ((long)psVar5 + ((ulong)bVar7 * -2 + 1) * 8);
          psVar6 = (storage_t<tinyusdz::value::matrix4d> *)((long)psVar6 + (ulong)bVar7 * -0x10 + 8)
          ;
        }
        pvVar2 = nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::value(&v);
        for (; lVar4 != 0; lVar4 = lVar4 + -1) {
          dst->m[0][0] = pvVar2->m[0][0];
          pvVar2 = (value_type *)((long)pvVar2 + ((ulong)bVar7 * -2 + 1) * 8);
          dst = (matrix4d *)((long)dst + ((ulong)bVar7 * -2 + 1) * 8);
        }
        return true;
      }
    }
  }
  if ((this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar1 = get_value<tinyusdz::value::matrix4d>(this,dst);
  }
  else {
    bVar1 = primvar::PrimVar::get_interpolated_value<tinyusdz::value::matrix4d>
                      (&this->_var,t,tinterp,dst);
  }
  return bVar1;
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }